

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplerTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::samplers::Sampler_testGuaranteedThroughputProbabilisticSamplerUpdate_Test::
Sampler_testGuaranteedThroughputProbabilisticSamplerUpdate_Test
          (Sampler_testGuaranteedThroughputProbabilisticSamplerUpdate_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_00221aa0;
  return;
}

Assistant:

TEST(Sampler, testGuaranteedThroughputProbabilisticSamplerUpdate)
{
    auto lowerBound = 2.0;
    auto samplingRate = 0.5;
    GuaranteedThroughputProbabilisticSampler sampler(lowerBound, samplingRate);
    ASSERT_EQ(lowerBound, sampler.lowerBound());
    ASSERT_EQ(samplingRate, sampler.samplingRate());

    auto newLowerBound = 1.0;
    auto newSamplingRate = 0.6;
    sampler.update(newLowerBound, newSamplingRate);
    ASSERT_EQ(newLowerBound, sampler.lowerBound());
    ASSERT_EQ(newSamplingRate, sampler.samplingRate());

    newSamplingRate = 1.1;
    sampler.update(newLowerBound, newSamplingRate);
    ASSERT_EQ(1.0, sampler.samplingRate());
}